

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>::
insert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,capnp::Text::Reader&>
          (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> table,size_t pos,
          Reader *params)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar4;
  StringPtr *in_R9;
  Maybe<unsigned_long> MVar5;
  Iterator iter;
  ArrayPtr<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> table_local;
  SearchKey local_40;
  Entry *local_38;
  ArrayPtr<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *local_30;
  
  table_local.ptr = (Entry *)table.size_;
  local_38 = table.ptr;
  local_30 = &table_local;
  local_40._vptr_SearchKey = (_func_int **)&PTR_search_001d5028;
  table_local.size_ = pos;
  _::BTreeImpl::insert(&iter,(BTreeImpl *)&(local_38->key).super_StringPtr.content.size_,&local_40);
  uVar3 = (ulong)iter.row;
  if (uVar3 == 0xe) {
    uVar3 = 0xe;
  }
  else {
    uVar1 = (iter.leaf)->rows[uVar3].i;
    if (uVar1 != 0) {
      bVar2 = StringPtr::operator==((StringPtr *)(table_local.ptr + (uVar1 - 1)),in_R9);
      uVar3 = (ulong)iter.row;
      if (bVar2) {
        uVar1 = (iter.leaf)->rows[uVar3].i;
        *this = (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(uVar1 - 1);
        aVar4 = extraout_RDX;
        goto LAB_0017384f;
      }
    }
  }
  memmove((iter.leaf)->rows + uVar3 + 1,(iter.leaf)->rows + uVar3,
          (ulong)((int)uVar3 + 1) * -4 + 0x38);
  (iter.leaf)->rows[uVar3].i = (int)params + 1;
  *this = (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>)0x0;
  aVar4 = extraout_RDX_00;
LAB_0017384f:
  MVar5.ptr.field_1.value = aVar4.value;
  MVar5.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar5.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return nullptr;
    }
  }